

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twitch_irc.cpp
# Opt level: O2

void __thiscall twitch_irc::handle_connect(twitch_irc *this,error_code *error,iterator *it)

{
  bool bVar1;
  ostream *poVar2;
  int __fd;
  basic_resolver_entry<boost::asio::ip::tcp> endpoint;
  data_union dStack_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [5];
  basic_resolver_iterator<boost::asio::ip::tcp> local_70;
  bind_t<void,_boost::_mfi::mf2<void,_twitch_irc,_const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>,_boost::_bi::list3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>_>
  local_58;
  basic_resolver_iterator<boost::asio::ip::tcp> *b;
  
  if (error->failed_ == false) {
    std::function<void_()>::operator()(&this->on_connect);
    std::__cxx11::string::string((string *)local_d8,"\r\n",(allocator *)&dStack_f8.base);
    local_58.f_.f_ = (F)read;
    local_58.f_._8_8_ = 0;
    local_58.l_.
    super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
    .super_storage2<boost::_bi::value<twitch_irc_*>,_boost::arg<1>_>.
    super_storage1<boost::_bi::value<twitch_irc_*>_>.a1_.t_ =
         (storage1<boost::_bi::value<twitch_irc_*>_>)
         (storage1<boost::_bi::value<twitch_irc_*>_>)this;
    boost::asio::
    async_read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::allocator<char>,boost::_bi::bind_t<void,boost::_mfi::mf1<void,twitch_irc,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<twitch_irc*>,boost::arg<1>>>>
              (&this->socket,&this->read_buffer,(string *)local_d8,
               (bind_t<void,_boost::_mfi::mf1<void,_twitch_irc,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<twitch_irc_*>,_boost::arg<1>_>_>
                *)&local_58);
  }
  else {
    b = (basic_resolver_iterator<boost::asio::ip::tcp> *)local_d8;
    local_d8._0_8_ = (element_type *)0x0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0;
    local_c8[0]._M_allocated_capacity._0_4_ = 0;
    local_c8[0]._M_allocated_capacity._4_4_ = 0;
    bVar1 = boost::asio::ip::operator!=(it,b);
    __fd = (int)b;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    if (bVar1) {
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::close(&(this->socket).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ,__fd);
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::basic_resolver_entry
                ((basic_resolver_entry<boost::asio::ip::tcp> *)local_d8,
                 (basic_resolver_entry<boost::asio::ip::tcp> *)
                 (it->index_ * 0x60 +
                 (long)(((it->values_).
                         super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->
                       super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                       )._M_impl.super__Vector_impl_data._M_start));
      dStack_f8._20_8_ = CONCAT44(local_c8[0]._8_4_,local_c8[0]._M_allocated_capacity._4_4_);
      dStack_f8._16_4_ = (undefined4)local_c8[0]._M_allocated_capacity;
      dStack_f8._0_8_ = local_d8._0_8_;
      dStack_f8._8_4_ = local_d8._8_4_;
      dStack_f8._12_4_ = local_d8._12_4_;
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::increment(it);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
                (&local_70,it);
      boost::
      bind<void,twitch_irc,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,twitch_irc*,boost::arg<1>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>
                (&local_58,(boost *)handle_connect,0,this,&local_70);
      boost::asio::
      basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_connect<boost::_bi::bind_t<void,boost::_mfi::mf2<void,twitch_irc,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>,boost::_bi::list3<boost::_bi::value<twitch_irc*>,boost::arg<1>,boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>>>>
                ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->socket,(endpoint_type *)&dStack_f8.base,&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.l_.
                  super_storage3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>
                  .a3_.t_.values_.
                  super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.values_.
                  super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::~basic_resolver_entry
                ((basic_resolver_entry<boost::asio::ip::tcp> *)local_d8);
      return;
    }
    (*error->cat_->_vptr_error_category[4])((string *)local_d8,error->cat_,(ulong)(uint)error->val_)
    ;
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)local_d8);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)local_d8);
  return;
}

Assistant:

void twitch_irc::handle_connect(const boost::system::error_code &error, tcp::resolver::iterator it)
{
    if (!error) {
        on_connect();
        boost::asio::async_read_until(socket, read_buffer, "\r\n",
                                      bind(&twitch_irc::read, this, _1));
    } else if (it != tcp::resolver::iterator()) {
        socket.close();
        auto endpoint = *it;
        socket.async_connect(endpoint,
                             bind(&twitch_irc::handle_connect, this, _1, ++it));
    } else {
        cerr << error.message() << endl;
    }

}